

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O1

void __thiscall NaPolynomialFunc::Function(NaPolynomialFunc *this,NaReal *x,NaReal *y)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar2;
  double dVar3;
  
  if ((this->vfK).nItems == 0) {
    *y = *x;
  }
  else {
    iVar1 = (*(this->vfK)._vptr_NaDynAr[0xf])(&this->vfK,0);
    *y = *(NaReal *)CONCAT44(extraout_var,iVar1);
    if (1 < (this->vfK).nItems) {
      dVar3 = 1.0;
      uVar2 = 1;
      do {
        dVar3 = dVar3 * *x;
        iVar1 = (*(this->vfK)._vptr_NaDynAr[0xf])(&this->vfK,(ulong)uVar2);
        *y = *(double *)CONCAT44(extraout_var_00,iVar1) * dVar3 + *y;
        uVar2 = uVar2 + 1;
      } while ((int)uVar2 < (this->vfK).nItems);
    }
  }
  return;
}

Assistant:

void
NaPolynomialFunc::Function (NaReal* x, NaReal* y)
{
    NaReal	xi = 1;
    if(vfK.count() == 0)
	*y = *x;
    else {
	*y = vfK[0];
	NaReal xi = 1;
	for(int i = 1; i < vfK.count(); ++i) {
	    xi *= *x;
	    *y += vfK[i] * xi;
	}
    }
}